

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O2

void __thiscall bidirectional::BiDirectional::joinLabels(BiDirectional *this)

{
  double *pdVar1;
  Search *pSVar2;
  DiGraph *pDVar3;
  Label *pLVar4;
  bool bVar5;
  _Rb_tree_color _Var6;
  int *piVar7;
  _Base_ptr p_Var8;
  long lVar9;
  long lVar10;
  Label *fwd_label;
  Params *pPVar11;
  _Base_ptr p_Var12;
  Label *bwd_label;
  double dVar13;
  __single_object bwd_min;
  __single_object fwd_min;
  vector<labelling::Label,_std::allocator<labelling::Label>_> merged_labels_;
  bool local_165;
  int local_164;
  double local_160;
  _Head_base<0UL,_double_*,_false> local_158;
  __shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *local_150;
  unique_ptr<double,_std::default_delete<double>_> local_148;
  vector<double,_std::allocator<double>_> *local_140;
  long local_138;
  double *local_130;
  LemonArc local_128 [2];
  _Head_base<0UL,_lemon::SmartDigraph_*,_false> local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  double local_108;
  Params *local_100;
  vector<labelling::Label,_std::allocator<labelling::Label>_> local_f8;
  undefined1 local_e0 [52];
  undefined4 uStack_ac;
  int local_a8;
  
  pPVar11 = (this->params_ptr_)._M_t.
            super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
            ._M_t.
            super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
            .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl;
  local_160 = getUB(this);
  local_130 = (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + pPVar11->critical_res;
  pdVar1 = (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + pPVar11->critical_res;
  dVar13 = *local_130;
  if (*pdVar1 <= dVar13 && dVar13 != *pdVar1) {
    local_130 = pdVar1;
  }
  std::make_unique<double>();
  std::make_unique<double>();
  getMinimumWeights(this,(double *)
                         local_148._M_t.super___uniq_ptr_impl<double,_std::default_delete<double>_>.
                         _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl,local_158._M_head_impl)
  ;
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = (this->fwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var12 = (_Base_ptr)((long)&(pSVar2->visited_vertices)._M_t + 8);
  local_140 = &this->min_res;
  local_150 = &(this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>;
  local_118 = p_Var12;
  local_100 = pPVar11;
  for (p_Var8 = *(_Base_ptr *)((long)&(pSVar2->visited_vertices)._M_t + 0x18); p_Var8 != p_Var12;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    pSVar2 = (this->fwd_search_ptr_)._M_t.
             super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
             .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
    _Var6 = p_Var8[1]._M_color;
    if ((**(double **)
           (*(long *)&(pSVar2->best_labels).
                      super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                      ._M_impl + (long)(int)_Var6 * 0x10) + *local_158._M_head_impl <= local_160) &&
       (_Var6 != (((this->graph_ptr_)._M_t.
                   super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                   .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->sink).
                 lemon_id)) {
      lVar10 = *(long *)&(pSVar2->efficient_labels).
                         super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                         ._M_impl;
      local_110 = p_Var8;
      for (fwd_label = *(Label **)(lVar10 + (long)(int)_Var6 * 0x18); p_Var12 = local_118,
          fwd_label != *(Label **)(lVar10 + 8 + (long)(int)_Var6 * 0x18); fwd_label = fwd_label + 1)
      {
        if (((fwd_label->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[pPVar11->critical_res] <= *local_130) &&
           (fwd_label->weight + *local_158._M_head_impl <= local_160)) {
          local_120._M_head_impl =
               *(SmartDigraph **)
                &(((this->graph_ptr_)._M_t.
                   super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                   .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->
                 lemon_graph_ptr)._M_t.
                 super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
          ;
          piVar7 = (int *)(*(long *)local_120._M_head_impl + (long)(int)_Var6 * 8 + 4);
          while( true ) {
            local_128[0]._id = *piVar7;
            lVar10 = (long)local_128[0]._id;
            p_Var8 = local_110;
            if (lVar10 == -1) break;
            pDVar3 = (this->graph_ptr_)._M_t.
                     super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                     .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
            local_164 = *(int *)(*(long *)((long)(pDVar3->lemon_graph_ptr)._M_t.
                                                 super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                          + 0x18) + lVar10 * 0x10);
            local_138 = *(long *)((long)(pDVar3->weight_map_ptr)._M_t.
                                        super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                 + 0x18);
            local_e0._48_4_ = 1;
            bVar5 = checkVertexVisited(this,(Directions *)(local_e0 + 0x30),&local_164);
            if ((bVar5) &&
               (local_164 !=
                (((this->graph_ptr_)._M_t.
                  super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                  .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->source).
                lemon_id)) {
              pSVar2 = (this->bwd_search_ptr_)._M_t.
                       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                       .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
              if (fwd_label->weight + *(double *)(local_138 + lVar10 * 8) +
                  **(double **)
                    (*(long *)&(pSVar2->best_labels).
                               super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                               ._M_impl + (long)local_164 * 0x10) <= local_160) {
                lVar9 = *(long *)&(pSVar2->efficient_labels).
                                  super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                  ._M_impl;
                for (bwd_label = *(Label **)(lVar9 + (long)local_164 * 0x18);
                    bwd_label != *(Label **)(lVar9 + 8 + (long)local_164 * 0x18);
                    bwd_label = bwd_label + 1) {
                  if (((*local_130 <=
                        (bwd_label->resource_consumption).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[pPVar11->critical_res]) &&
                      (fwd_label->weight + *(double *)(local_138 + lVar10 * 8) + bwd_label->weight
                       <= local_160)) &&
                     (bVar5 = labelling::mergePreCheck(fwd_label,bwd_label,&this->max_res), bVar5))
                  {
                    local_165 = true;
                    DiGraph::getAdjVertex
                              ((AdjVertex *)local_e0,
                               (this->graph_ptr_)._M_t.
                               super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                               .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl,
                               local_128,&local_165);
                    labelling::mergeLabels
                              ((Label *)(local_e0 + 0x30),fwd_label,bwd_label,(AdjVertex *)local_e0,
                               &((this->graph_ptr_)._M_t.
                                 super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                                 .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>.
                                _M_head_impl)->sink,&this->max_res,local_140);
                    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                              ((_Vector_base<double,_std::allocator<double>_> *)(local_e0 + 0x10));
                    if (local_a8 == -1) {
LAB_001549b7:
                      bVar5 = true;
                      std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
                                (&local_f8,(value_type *)(local_e0 + 0x30));
                    }
                    else {
                      local_e0._0_4_ = local_e0._0_4_ & 0xffffff00;
                      bVar5 = labelling::Label::checkFeasibility
                                        ((Label *)(local_e0 + 0x30),&this->max_res,local_140,
                                         (bool *)local_e0);
                      if ((!bVar5) ||
                         (bVar5 = labelling::halfwayCheck((Label *)(local_e0 + 0x30),&local_f8),
                         !bVar5)) goto LAB_001549b7;
                      pLVar4 = ((__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *)
                               &local_150->_M_ptr)->_M_ptr;
                      if ((pLVar4->vertex).lemon_id != -1) {
                        local_e0._0_4_ = 0;
                        bVar5 = labelling::Label::fullDominance
                                          ((Label *)(local_e0 + 0x30),pLVar4,(Directions *)local_e0)
                        ;
                        if ((!bVar5) &&
                           (dVar13 = ((__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *)
                                     &local_150->_M_ptr)->_M_ptr->weight,
                           dVar13 < (double)CONCAT44(uStack_ac,local_e0._48_4_) ||
                           dVar13 == (double)CONCAT44(uStack_ac,local_e0._48_4_)))
                        goto LAB_001549b7;
                      }
                      std::make_shared<labelling::Label,labelling::Label_const&>((Label *)local_e0);
                      std::__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>::operator=
                                (local_150,
                                 (__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *)
                                 local_e0);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
                      pLVar4 = (this->best_label_).
                               super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                      local_108 = pLVar4->weight;
                      local_e0._0_4_ = 0;
                      bVar5 = terminate(this,(Directions *)local_e0,pLVar4);
                      dVar13 = local_108;
                      if (local_160 <= local_108) {
                        dVar13 = local_160;
                      }
                      local_160 = dVar13;
                      if (!bVar5) goto LAB_001549b7;
                      bVar5 = false;
                    }
                    labelling::Label::~Label((Label *)(local_e0 + 0x30));
                    pPVar11 = local_100;
                    if (!bVar5) goto LAB_00154a5c;
                  }
                  lVar9 = *(long *)&(((this->bwd_search_ptr_)._M_t.
                                      super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                      .super__Head_base<0UL,_bidirectional::Search_*,_false>.
                                     _M_head_impl)->efficient_labels).
                                    super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                    ._M_impl;
                }
              }
            }
            piVar7 = (int *)(*(long *)((long)local_120._M_head_impl + 0x18) +
                             (long)local_128[0]._id * 0x10 + 0xc);
          }
        }
        _Var6 = p_Var8[1]._M_color;
        lVar10 = *(long *)&(((this->fwd_search_ptr_)._M_t.
                             super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                             .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl)->
                           efficient_labels).
                           super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                           ._M_impl;
      }
    }
  }
LAB_00154a5c:
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::~vector(&local_f8);
  std::unique_ptr<double,_std::default_delete<double>_>::~unique_ptr
            ((unique_ptr<double,_std::default_delete<double>_> *)&local_158);
  std::unique_ptr<double,_std::default_delete<double>_>::~unique_ptr(&local_148);
  return;
}

Assistant:

void BiDirectional::joinLabels() {
  // ref id with critical_res
  SPDLOG_INFO("Merging");
  const int&    c_res   = params_ptr_->critical_res;
  double        UB      = getUB();
  const double& HF      = std::min(max_res_curr_[c_res], min_res_curr_[c_res]);
  auto          fwd_min = std::make_unique<double>();
  auto          bwd_min = std::make_unique<double>();
  // lower bounds on forward and backward labels
  getMinimumWeights(fwd_min.get(), bwd_min.get());

  std::vector<labelling::Label> merged_labels_;

  // for each vertex visited forward
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    // if bound check fwd_label
    if (fwd_search_ptr_->best_labels[n]->weight + *bwd_min <= UB &&
        n != graph_ptr_->sink.lemon_id) {
      // for each forward label at n
      for (auto fwd_iter = fwd_search_ptr_->efficient_labels[n].cbegin();
           fwd_iter != fwd_search_ptr_->efficient_labels[n].cend();
           ++fwd_iter) {
        const labelling::Label& fwd_label = *fwd_iter;
        // if bound check fwd_label
        if (fwd_label.resource_consumption[c_res] <= HF &&
            fwd_label.weight + *bwd_min <= UB) {
          // for each successor of n
          for (LemonGraph::OutArcIt a(
                   *graph_ptr_->lemon_graph_ptr, graph_ptr_->getLNodeFromId(n));
               a != lemon::INVALID;
               ++a) {
            const int&    m           = graph_ptr_->getId(graph_ptr_->head(a));
            const double& edge_weight = graph_ptr_->getWeight(a);
            if (checkVertexVisited(BWD, m) &&
                m != graph_ptr_->source.lemon_id &&
                (fwd_label.weight + edge_weight +
                     bwd_search_ptr_->best_labels[m]->weight <=
                 UB)) {
              // for each backward label at m
              for (auto bwd_iter =
                       bwd_search_ptr_->efficient_labels[m].cbegin();
                   bwd_iter != bwd_search_ptr_->efficient_labels[m].cend();
                   ++bwd_iter) {
                const labelling::Label& bwd_label = *bwd_iter;
                // TODO: should suffice with strict > HF, but Beasley 10
                // fails
                if (bwd_label.resource_consumption[c_res] >= HF &&
                    (fwd_label.weight + edge_weight + bwd_label.weight <= UB) &&
                    labelling::mergePreCheck(fwd_label, bwd_label, max_res)) {
                  const labelling::Label& merged_label = labelling::mergeLabels(
                      fwd_label,
                      bwd_label,
                      graph_ptr_->getAdjVertex(a, true),
                      graph_ptr_->sink,
                      max_res,
                      min_res);
                  if (merged_label.vertex.lemon_id != -1 &&
                      merged_label.checkFeasibility(max_res, min_res) &&
                      labelling::halfwayCheck(merged_label, merged_labels_)) {
                    if (best_label_->vertex.lemon_id == -1 ||
                        (merged_label.fullDominance(*best_label_, FWD) ||
                         merged_label.weight < best_label_->weight)) {
                      // Save
                      best_label_ =
                          std::make_shared<labelling::Label>(merged_label);
                      SPDLOG_INFO(
                          "\t {} \t | \t {}",
                          getElapsedTime(),
                          best_label_->weight);
                      // Tighten UB
                      if (best_label_->weight < UB) {
                        UB = best_label_->weight;
                      }
                      // Stop if time out or threshold found
                      if (terminate(FWD, *best_label_)) {
                        return;
                      }
                    }
                  }
                  // Add merged label to list
                  merged_labels_.push_back(merged_label);
                } // else
                  // break;
              }
            }
          }
        } // else
          // break;
      }
    }
  }
}